

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::raw_hash_set(raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *this,size_t bucket_count,hasher *hash,key_equal *eq,allocator_type *alloc)

{
  undefined1 auVar1 [16];
  _Any_data local_40;
  undefined1 local_30 [16];
  
  this->ctrl_ = EmptyGroup()::empty_group;
  this->capacity_ = 0;
  this->slots_ = (slot_type *)0x0;
  this->size_ = 0;
  std::
  function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_40,hash);
  (this->settings_).
  super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  .
  super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_0UL,_false>
  .value = 0;
  *(undefined8 *)
   &(this->settings_).
    super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
    .
    super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_1UL,_false>
    .value.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->settings_).
           super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
           .
           super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_1UL,_false>
           .value.super__Function_base._M_functor + 8) = 0;
  (this->settings_).
  super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  .
  super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_1UL,_false>
  .value.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->settings_).
  super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  .
  super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_1UL,_false>
  .value._M_invoker = (_Invoker_type)local_30._8_8_;
  auVar1 = local_30;
  if ((_Manager_type)local_30._0_8_ != (_Manager_type)0x0) {
    *(void **)&(this->settings_).
               super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
               .
               super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_1UL,_false>
               .value.super__Function_base._M_functor = local_40._M_unused._M_object;
    *(undefined8 *)
     ((long)&(this->settings_).
             super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
             .
             super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_1UL,_false>
             .value.super__Function_base._M_functor + 8) = local_40._8_8_;
    (this->settings_).
    super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
    .
    super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_1UL,_false>
    .value.super__Function_base._M_manager = (_Manager_type)local_30._0_8_;
    auVar1 = ZEXT816(0) << 0x20;
  }
  local_30 = auVar1;
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  if (bucket_count != 0) {
    this->capacity_ = 0xffffffffffffffff >> (LZCOUNT(bucket_count) & 0x3fU);
    reset_growth_left(this);
    initialize_slots(this);
  }
  return;
}

Assistant:

explicit raw_hash_set(size_t bucket_count, const hasher& hash = hasher(),
                          const key_equal& eq = key_equal(),
                          const allocator_type& alloc = allocator_type())
        : ctrl_(EmptyGroup()), settings_(0, hash, eq, alloc) {
        if (bucket_count) {
            capacity_ = NormalizeCapacity(bucket_count);
            reset_growth_left();
            initialize_slots();
        }
    }